

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

uint Validator::constraintS6(Solution *solution)

{
  pointer ppTVar1;
  pointer ppTVar2;
  int iVar3;
  int iVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar5;
  Nurse *pNVar6;
  History *this;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar7;
  Scenario *this_00;
  string *psVar8;
  _Base_ptr p_Var9;
  Contract contract;
  uint local_9c;
  string local_90;
  Contract local_70;
  
  pmVar5 = Solution::getNurses_abi_cxx11_(solution);
  p_Var9 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_9c = 0;
  do {
    if ((_Rb_tree_header *)p_Var9 == &(pmVar5->_M_t)._M_impl.super__Rb_tree_header) {
      return local_9c;
    }
    pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var9 + 2));
    this = Nurse::getHistory(pNVar6);
    iVar3 = History::getNumberOfAssignments(this);
    pvVar7 = NurseSolution::getTurns(*(NurseSolution **)(p_Var9 + 2));
    ppTVar1 = (pvVar7->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    ppTVar2 = (pvVar7->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    this_00 = Scenario::getInstance();
    pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var9 + 2));
    psVar8 = Nurse::getContract_abi_cxx11_(pNVar6);
    std::__cxx11::string::string((string *)&local_90,(string *)psVar8);
    Scenario::getContract(&local_70,this_00,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    iVar4 = Contract::getMaximumNumberOfAssignments(&local_70);
    iVar3 = iVar3 + (int)((ulong)((long)ppTVar1 - (long)ppTVar2) >> 3);
    if (iVar4 < iVar3) {
      iVar4 = Contract::getMaximumNumberOfAssignments(&local_70);
      iVar3 = iVar3 - iVar4;
LAB_00111ebe:
      local_9c = local_9c + iVar3 * 0x14;
    }
    else {
      iVar4 = Contract::getMinimumNumberOfAssignments(&local_70);
      if (iVar3 < iVar4) {
        iVar4 = Contract::getMinimumNumberOfAssignments(&local_70);
        iVar3 = iVar4 - iVar3;
        goto LAB_00111ebe;
      }
    }
    std::__cxx11::string::~string((string *)&local_70);
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
  } while( true );
}

Assistant:

unsigned int Validator::constraintS6(const Solution &solution){

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
    {
        int totalAssignments = nurse.second->getNurse()->getHistory().getNumberOfAssignments();
        totalAssignments += nurse.second->getTurns().size();
        Contract contract = Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract());
        if(totalAssignments > contract.getMaximumNumberOfAssignments())
            sum += 20 * (totalAssignments-contract.getMaximumNumberOfAssignments());
        else if (totalAssignments < contract.getMinimumNumberOfAssignments())
            sum += 20 * (contract.getMinimumNumberOfAssignments() - totalAssignments);
    }
    return  sum;
}